

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_msa_st_w_mips64el(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  uint mmu_idx;
  TCGMemOpIdx oi;
  long lVar1;
  uintptr_t unaff_retaddr;
  
  lVar1 = (ulong)wd * 0x10;
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  oi = mmu_idx + 0x720;
  ensure_writable_pages(env,addr,mmu_idx,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict14 *)env,addr,(env->active_fpu).fpr[wd].w[0],oi,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict14 *)env,addr + 4,
             *(uint32_t *)((long)(env->active_fpu).fpr + lVar1 + 4),oi,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict14 *)env,addr + 8,
             *(uint32_t *)((long)(env->active_fpu).fpr + lVar1 + 8),oi,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict14 *)env,addr + 0xc,
             *(uint32_t *)((long)(env->active_fpu).fpr + lVar1 + 0xc),oi,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_w(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_WORD)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stl_mmu(env, addr + (0 << DF_WORD), pwd->w[0], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (1 << DF_WORD), pwd->w[1], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (2 << DF_WORD), pwd->w[2], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (3 << DF_WORD), pwd->w[3], oi, GETPC());
#else
    helper_ret_stl_mmu(env, addr + (1 << DF_WORD), pwd->w[0], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (0 << DF_WORD), pwd->w[1], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (3 << DF_WORD), pwd->w[2], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (2 << DF_WORD), pwd->w[3], oi, GETPC());
#endif
}